

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::delete_vertex
          (PolyConnectivity *this,VertexHandle _vh,bool _delete_isolated_vertices)

{
  StatusInfo *pSVar1;
  BaseHandle *pBVar2;
  undefined1 local_70 [8];
  VFIter vf_it;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_handles;
  BaseHandle local_38;
  BaseHandle local_34;
  
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = 0;
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0;
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::reserve
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
             &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,8);
  local_34 = _vh.super_BaseHandle.idx_;
  vf_iter((VertexFaceIter *)local_70,this,_vh);
  while ((pBVar2 = (BaseHandle *)
                   vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_,
         vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    local_38.idx_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)local_70);
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
    emplace_back<OpenMesh::FaceHandle>
              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
               &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
               (FaceHandle *)&local_38);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_70);
  }
  for (; pBVar2 != (BaseHandle *)0x0; pBVar2 = pBVar2 + 1) {
    delete_face(this,(FaceHandle)pBVar2->idx_,_delete_isolated_vertices);
  }
  pSVar1 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
  *(byte *)&pSVar1->status_ = (byte)pSVar1->status_ | 1;
  std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
             &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  return;
}

Assistant:

void PolyConnectivity::delete_vertex(VertexHandle _vh, bool _delete_isolated_vertices)
{
  // store incident faces
  std::vector<FaceHandle> face_handles;
  face_handles.reserve(8);
  for (VFIter vf_it(vf_iter(_vh)); vf_it.is_valid(); ++vf_it)
    face_handles.push_back(*vf_it);


  // delete collected faces
  std::vector<FaceHandle>::iterator fh_it(face_handles.begin()),
                                    fh_end(face_handles.end());

  for (; fh_it!=fh_end; ++fh_it)
    delete_face(*fh_it, _delete_isolated_vertices);

  status(_vh).set_deleted(true);
}